

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_Line * __thiscall
ON_MeshTopology::TopEdgeLine(ON_Line *__return_storage_ptr__,ON_MeshTopology *this,int tope_index)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ON_Mesh *mesh;
  ON_MeshTopologyEdge *pOVar4;
  ON_MeshTopologyVertex *pOVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  long lVar12;
  double dVar13;
  double dVar14;
  ON_3dPointListRef vertex_list;
  ON_3dPointListRef local_38;
  
  from_pt.y = ON_3dPoint::UnsetPoint.y;
  from_pt.x = ON_3dPoint::UnsetPoint.x;
  from_pt.z = ON_3dPoint::UnsetPoint.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(__return_storage_ptr__,from_pt,to_pt);
  if (((-1 < tope_index) && (mesh = this->m_mesh, mesh != (ON_Mesh *)0x0)) &&
     (tope_index < (this->m_tope).m_count)) {
    pOVar4 = (this->m_tope).m_a;
    iVar1 = pOVar4[(uint)tope_index].m_topvi[0];
    lVar12 = (long)iVar1;
    if ((-1 < lVar12) && (uVar2 = (this->m_topv).m_count, iVar1 < (int)uVar2)) {
      uVar3 = pOVar4[(uint)tope_index].m_topvi[1];
      if (uVar3 < uVar2 && -1 < (int)uVar3) {
        pOVar5 = (this->m_topv).m_a;
        if (((0 < pOVar5[lVar12].m_v_count) && ((uint *)pOVar5[lVar12].m_vi != (uint *)0x0)) &&
           ((0 < pOVar5[uVar3].m_v_count &&
            (((((uint *)pOVar5[uVar3].m_vi != (uint *)0x0 &&
               (uVar2 = *pOVar5[lVar12].m_vi, -1 < (int)uVar2)) &&
              (iVar1 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, (int)uVar2 < iVar1)) &&
             ((uVar3 = *pOVar5[uVar3].m_vi, -1 < (int)uVar3 && ((int)uVar3 < iVar1)))))))) {
          ON_3dPointListRef::ON_3dPointListRef(&local_38,mesh);
          dVar7 = -1.23432101234321e+308;
          dVar8 = -1.23432101234321e+308;
          dVar13 = -1.23432101234321e+308;
          dVar14 = -1.23432101234321e+308;
          dVar10 = dVar7;
          dVar11 = dVar8;
          if (uVar2 < local_38.m_point_count) {
            if (local_38.m_dP == (double *)0x0) {
              dVar10 = (double)(float)*(undefined8 *)
                                       (local_38.m_fP + uVar2 * local_38.m_point_stride);
              dVar11 = (double)(float)((ulong)*(undefined8 *)
                                               (local_38.m_fP + uVar2 * local_38.m_point_stride) >>
                                      0x20);
              dVar14 = (double)local_38.m_fP[(ulong)(uVar2 * local_38.m_point_stride) + 2];
            }
            else {
              dVar10 = local_38.m_dP[uVar2 * local_38.m_point_stride];
              dVar11 = (local_38.m_dP + uVar2 * local_38.m_point_stride)[1];
              dVar14 = local_38.m_dP[(ulong)(uVar2 * local_38.m_point_stride) + 2];
            }
          }
          auVar9._8_4_ = SUB84(dVar11,0);
          auVar9._0_8_ = dVar10;
          auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
          (__return_storage_ptr__->from).x = dVar10;
          (__return_storage_ptr__->from).y = (double)auVar9._8_8_;
          (__return_storage_ptr__->from).z = dVar14;
          if (uVar3 < local_38.m_point_count) {
            if (local_38.m_dP == (double *)0x0) {
              dVar7 = (double)(float)*(undefined8 *)
                                      (local_38.m_fP + uVar3 * local_38.m_point_stride);
              dVar8 = (double)(float)((ulong)*(undefined8 *)
                                              (local_38.m_fP + uVar3 * local_38.m_point_stride) >>
                                     0x20);
              dVar13 = (double)local_38.m_fP[(ulong)(uVar3 * local_38.m_point_stride) + 2];
            }
            else {
              dVar7 = local_38.m_dP[uVar3 * local_38.m_point_stride];
              dVar8 = (local_38.m_dP + uVar3 * local_38.m_point_stride)[1];
              dVar13 = local_38.m_dP[(ulong)(uVar3 * local_38.m_point_stride) + 2];
            }
          }
          auVar6._8_4_ = SUB84(dVar8,0);
          auVar6._0_8_ = dVar7;
          auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
          (__return_storage_ptr__->to).x = dVar7;
          (__return_storage_ptr__->to).y = (double)auVar6._8_8_;
          (__return_storage_ptr__->to).z = dVar13;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_MeshTopology::TopEdgeLine( int tope_index ) const
{
  ON_Line L(ON_3dPoint::UnsetPoint,ON_3dPoint::UnsetPoint);
  if ( m_mesh && tope_index >= 0 && tope_index < m_tope.Count() )
  {
    const int* topvi = m_tope[tope_index].m_topvi;
    if (   topvi[0] >= 0 && topvi[0] < m_topv.Count() 
        && topvi[1] >= 0 && topvi[1] < m_topv.Count() )
    {
      const ON_MeshTopologyVertex& v0 = m_topv[topvi[0]];
      const ON_MeshTopologyVertex& v1 = m_topv[topvi[1]];
      if ( v0.m_v_count > 0 && v0.m_vi && v1.m_v_count > 0 && v1.m_vi )
      {
        int vi0 = v0.m_vi[0];
        int vi1 = v1.m_vi[0];
        int vcount = m_mesh->m_V.Count();
        if ( vi0 >= 0 && vi0 < vcount && vi1 >= 0 && vi1 < vcount )
        {
          const ON_3dPointListRef vertex_list(m_mesh);
          L.from = vertex_list[vi0];
          L.to   = vertex_list[vi1];
        }
      }
    }
  }
  return L;
}